

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::detail::generic_type::def_property_static_impl
          (generic_type *this,char *name,handle fget,handle fset,function_record *rec_func)

{
  PyObject *pPVar1;
  internals *piVar2;
  PyObject **ppPVar3;
  char *local_d8;
  PyTypeObject *local_d0;
  bool local_c2;
  bool local_c1;
  byte local_b1;
  str_attr_accessor local_b0;
  str local_90;
  none local_88;
  byte local_7d;
  handle local_70;
  handle local_68;
  byte local_59;
  object local_58;
  handle local_50;
  object local_48;
  handle local_40;
  handle property;
  bool has_doc;
  bool is_static;
  function_record *rec_func_local;
  char *name_local;
  generic_type *this_local;
  handle fset_local;
  handle fget_local;
  
  local_b1 = 0;
  this_local = (generic_type *)fset.m_ptr;
  fset_local.m_ptr = fget.m_ptr;
  if (rec_func != (function_record *)0x0) {
    local_c1 = false;
    if (((byte)rec_func->field_0x59 >> 4 & 1) != 0) {
      local_c1 = pybind11::handle::operator_cast_to_bool(&rec_func->scope);
    }
    local_b1 = local_c1 ^ 0xff;
  }
  property.m_ptr._7_1_ = local_b1 & 1;
  local_c2 = false;
  if ((rec_func != (function_record *)0x0) && (local_c2 = false, rec_func->doc != (char *)0x0)) {
    local_c2 = options::show_user_defined_docstrings();
  }
  property.m_ptr._6_1_ = local_c2;
  if ((property.m_ptr._7_1_ & 1) == 0) {
    local_d0 = (PyTypeObject *)&PyProperty_Type;
  }
  else {
    piVar2 = get_internals();
    local_d0 = piVar2->static_property_type;
  }
  pybind11::handle::handle<_object_*,_0>(&local_40,(_object *)local_d0);
  ppPVar3 = pybind11::handle::ptr(&fset_local);
  pPVar1 = *ppPVar3;
  local_59 = 0;
  if (pPVar1 == (PyObject *)0x0) {
    none::none((none *)&local_58);
    local_50 = local_58.super_handle.m_ptr;
  }
  else {
    local_50.m_ptr = fset_local.m_ptr;
  }
  local_59 = pPVar1 == (PyObject *)0x0;
  ppPVar3 = pybind11::handle::ptr((handle *)&this_local);
  pPVar1 = *ppPVar3;
  local_7d = 0;
  if (pPVar1 == (PyObject *)0x0) {
    none::none((none *)&local_70);
    local_68.m_ptr = local_70.m_ptr;
  }
  else {
    local_68.m_ptr = (PyObject *)this_local;
  }
  local_7d = pPVar1 == (PyObject *)0x0;
  none::none(&local_88);
  if ((property.m_ptr._6_1_ & 1) == 0) {
    local_d8 = "";
  }
  else {
    local_d8 = rec_func->doc;
  }
  str::str(&local_90,local_d8);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_48,&local_40,&local_50,(none *)&local_68,
             (str *)&local_88);
  object_api<pybind11::handle>::attr(&local_b0,(object_api<pybind11::handle> *)this,name);
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_b0,&local_48);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_b0);
  object::~object(&local_48);
  str::~str(&local_90);
  none::~none(&local_88);
  if ((local_7d & 1) != 0) {
    none::~none((none *)&local_70);
  }
  if ((local_59 & 1) != 0) {
    none::~none((none *)&local_58);
  }
  return;
}

Assistant:

void def_property_static_impl(const char *name,
                                  handle fget,
                                  handle fset,
                                  detail::function_record *rec_func) {
        const auto is_static = (rec_func != nullptr) && !(rec_func->is_method && rec_func->scope);
        const auto has_doc = (rec_func != nullptr) && (rec_func->doc != nullptr)
                             && pybind11::options::show_user_defined_docstrings();
        auto property = handle(
            (PyObject *) (is_static ? get_internals().static_property_type : &PyProperty_Type));
        attr(name) = property(fget.ptr() ? fget : none(),
                              fset.ptr() ? fset : none(),
                              /*deleter*/ none(),
                              pybind11::str(has_doc ? rec_func->doc : ""));
    }